

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# realdata_unit.c
# Opt level: O0

_Bool compare_xors(roaring_bitmap_t **rnorun,roaring_bitmap_t **rruns,size_t count)

{
  _Bool _Var1;
  roaring_bitmap_t *bitmap1;
  roaring_bitmap_t *in_RDX;
  roaring_bitmap_t *in_RSI;
  roaring_bitmap_t *in_RDI;
  size_t i;
  roaring_bitmap_t *temporruns;
  roaring_bitmap_t *tempornorun;
  roaring_bitmap_t *in_stack_00000060;
  roaring_bitmap_t *in_stack_00000068;
  roaring_bitmap_t *bitmap2;
  
  bitmap2 = (roaring_bitmap_t *)0x0;
  while( true ) {
    if (in_RDX <= (roaring_bitmap_t *)((long)&(bitmap2->high_low_container).size + 1U)) {
      return true;
    }
    roaring_bitmap_xor(in_stack_00000068,in_stack_00000060);
    _Var1 = is_xor_correct(in_RSI,in_RDX);
    if (!_Var1) {
      printf("no-run xor incorrect\n");
      return false;
    }
    bitmap1 = roaring_bitmap_xor(in_stack_00000068,in_stack_00000060);
    _Var1 = is_xor_correct(in_RSI,in_RDX);
    if (!_Var1) {
      printf("runs xors incorrect\n");
      return false;
    }
    _Var1 = slow_bitmap_equals(in_RDI,in_RSI);
    if (!_Var1) {
      printf("Xors don\'t agree! (slow) \n");
      return false;
    }
    _Var1 = roaring_bitmap_equals(in_RSI,in_RDX);
    if (!_Var1) {
      printf("Xors don\'t agree!\n");
      printf("\n\nbitmap1:\n");
      roaring_bitmap_printf_describe(in_RDX);
      printf("\n\nbitmap2:\n");
      roaring_bitmap_printf_describe(in_RDX);
      return false;
    }
    roaring_bitmap_free((roaring_bitmap_t *)0x103a70);
    roaring_bitmap_free((roaring_bitmap_t *)0x103a7a);
    inplace_xor(bitmap1,bitmap2);
    _Var1 = is_xor_correct(in_RSI,in_RDX);
    if (!_Var1) {
      printf("[inplace] no-run xor incorrect\n");
      return false;
    }
    inplace_xor(bitmap1,bitmap2);
    _Var1 = is_xor_correct(in_RSI,in_RDX);
    if (!_Var1) {
      printf("[inplace] runs xors incorrect\n");
      return false;
    }
    _Var1 = slow_bitmap_equals(in_RDI,in_RSI);
    if (!_Var1) break;
    _Var1 = roaring_bitmap_equals(in_RSI,in_RDX);
    if (!_Var1) {
      printf("[inplace] Xors don\'t agree!\n");
      printf("\n\nbitmap1:\n");
      roaring_bitmap_printf_describe(in_RDX);
      printf("\n\nbitmap2:\n");
      roaring_bitmap_printf_describe(in_RDX);
      return false;
    }
    roaring_bitmap_free((roaring_bitmap_t *)0x103bc9);
    roaring_bitmap_free((roaring_bitmap_t *)0x103bd3);
    bitmap2 = (roaring_bitmap_t *)((long)&(bitmap2->high_low_container).size + 1);
  }
  printf("[inplace] Xors don\'t agree! (slow) \n");
  return false;
}

Assistant:

bool compare_xors(roaring_bitmap_t **rnorun, roaring_bitmap_t **rruns,
                  size_t count) {
    roaring_bitmap_t *tempornorun;
    roaring_bitmap_t *temporruns;
    for (size_t i = 0; i + 1 < count; ++i) {
        tempornorun = roaring_bitmap_xor(rnorun[i], rnorun[i + 1]);
        if (!is_xor_correct(rnorun[i], rnorun[i + 1])) {
            printf("no-run xor incorrect\n");
            return false;
        }
        temporruns = roaring_bitmap_xor(rruns[i], rruns[i + 1]);
        if (!is_xor_correct(rruns[i], rruns[i + 1])) {
            printf("runs xors incorrect\n");
            return false;
        }
        if (!slow_bitmap_equals(tempornorun, temporruns)) {
            printf("Xors don't agree! (slow) \n");
            return false;
        }

        if (!roaring_bitmap_equals(tempornorun, temporruns)) {
            printf("Xors don't agree!\n");
            printf("\n\nbitmap1:\n");
            roaring_bitmap_printf_describe(tempornorun);  // debug
            printf("\n\nbitmap2:\n");
            roaring_bitmap_printf_describe(temporruns);  // debug
            return false;
        }
        roaring_bitmap_free(tempornorun);
        roaring_bitmap_free(temporruns);
        tempornorun = inplace_xor(rnorun[i], rnorun[i + 1]);
        if (!is_xor_correct(rnorun[i], rnorun[i + 1])) {
            printf("[inplace] no-run xor incorrect\n");
            return false;
        }
        temporruns = inplace_xor(rruns[i], rruns[i + 1]);
        if (!is_xor_correct(rruns[i], rruns[i + 1])) {
            printf("[inplace] runs xors incorrect\n");
            return false;
        }

        if (!slow_bitmap_equals(tempornorun, temporruns)) {
            printf("[inplace] Xors don't agree! (slow) \n");
            return false;
        }

        if (!roaring_bitmap_equals(tempornorun, temporruns)) {
            printf("[inplace] Xors don't agree!\n");
            printf("\n\nbitmap1:\n");
            roaring_bitmap_printf_describe(tempornorun);  // debug
            printf("\n\nbitmap2:\n");
            roaring_bitmap_printf_describe(temporruns);  // debug
            return false;
        }
        roaring_bitmap_free(tempornorun);
        roaring_bitmap_free(temporruns);
    }
    return true;
}